

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_dependence.cpp
# Opt level: O3

vector<spvtools::opt::SEConstantNode_*,_std::allocator<spvtools::opt::SEConstantNode_*>_> *
spvtools::opt::anon_unknown_15::GetAllTopLevelConstants
          (vector<spvtools::opt::SEConstantNode_*,_std::allocator<spvtools::opt::SEConstantNode_*>_>
           *__return_storage_ptr__,SENode *node)

{
  pointer ppSVar1;
  int iVar2;
  undefined4 extraout_var;
  vector<spvtools::opt::SEConstantNode_*,_std::allocator<spvtools::opt::SEConstantNode_*>_> *pvVar3;
  vector<spvtools::opt::SEConstantNode_*,_std::allocator<spvtools::opt::SEConstantNode_*>_>
  *extraout_RAX;
  vector<spvtools::opt::SEConstantNode_*,_std::allocator<spvtools::opt::SEConstantNode_*>_>
  *extraout_RAX_00;
  pointer ppSVar4;
  SEConstantNode *recurrent_node;
  vector<spvtools::opt::SEConstantNode_*,_std::allocator<spvtools::opt::SEConstantNode_*>_> local_38
  ;
  undefined4 extraout_var_00;
  
  (__return_storage_ptr__->
  super__Vector_base<spvtools::opt::SEConstantNode_*,_std::allocator<spvtools::opt::SEConstantNode_*>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<spvtools::opt::SEConstantNode_*,_std::allocator<spvtools::opt::SEConstantNode_*>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<spvtools::opt::SEConstantNode_*,_std::allocator<spvtools::opt::SEConstantNode_*>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar2 = (*node->_vptr_SENode[4])(node);
  local_38.
  super__Vector_base<spvtools::opt::SEConstantNode_*,_std::allocator<spvtools::opt::SEConstantNode_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)CONCAT44(extraout_var,iVar2);
  if (local_38.
      super__Vector_base<spvtools::opt::SEConstantNode_*,_std::allocator<spvtools::opt::SEConstantNode_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    std::vector<spvtools::opt::SEConstantNode*,std::allocator<spvtools::opt::SEConstantNode*>>::
    _M_realloc_insert<spvtools::opt::SEConstantNode*const&>
              ((vector<spvtools::opt::SEConstantNode*,std::allocator<spvtools::opt::SEConstantNode*>>
                *)__return_storage_ptr__,(iterator)0x0,(SEConstantNode **)&local_38);
  }
  iVar2 = (*node->_vptr_SENode[8])(node);
  pvVar3 = (vector<spvtools::opt::SEConstantNode_*,_std::allocator<spvtools::opt::SEConstantNode_*>_>
            *)CONCAT44(extraout_var_00,iVar2);
  if (pvVar3 != (vector<spvtools::opt::SEConstantNode_*,_std::allocator<spvtools::opt::SEConstantNode_*>_>
                 *)0x0) {
    ppSVar1 = (pvVar3->
              super__Vector_base<spvtools::opt::SEConstantNode_*,_std::allocator<spvtools::opt::SEConstantNode_*>_>
              )._M_impl.super__Vector_impl_data._M_end_of_storage;
    for (ppSVar4 = (pvVar3->
                   super__Vector_base<spvtools::opt::SEConstantNode_*,_std::allocator<spvtools::opt::SEConstantNode_*>_>
                   )._M_impl.super__Vector_impl_data._M_finish; ppSVar4 != ppSVar1;
        ppSVar4 = ppSVar4 + 1) {
      GetAllTopLevelConstants(&local_38,&(*ppSVar4)->super_SENode);
      std::vector<spvtools::opt::SEConstantNode*,std::allocator<spvtools::opt::SEConstantNode*>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<spvtools::opt::SEConstantNode**,std::vector<spvtools::opt::SEConstantNode*,std::allocator<spvtools::opt::SEConstantNode*>>>>
                ((vector<spvtools::opt::SEConstantNode*,std::allocator<spvtools::opt::SEConstantNode*>>
                  *)__return_storage_ptr__,
                 (__return_storage_ptr__->
                 super__Vector_base<spvtools::opt::SEConstantNode_*,_std::allocator<spvtools::opt::SEConstantNode_*>_>
                 )._M_impl.super__Vector_impl_data._M_finish,
                 local_38.
                 super__Vector_base<spvtools::opt::SEConstantNode_*,_std::allocator<spvtools::opt::SEConstantNode_*>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 local_38.
                 super__Vector_base<spvtools::opt::SEConstantNode_*,_std::allocator<spvtools::opt::SEConstantNode_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      pvVar3 = extraout_RAX;
      if (local_38.
          super__Vector_base<spvtools::opt::SEConstantNode_*,_std::allocator<spvtools::opt::SEConstantNode_*>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_38.
                        super__Vector_base<spvtools::opt::SEConstantNode_*,_std::allocator<spvtools::opt::SEConstantNode_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_38.
                              super__Vector_base<spvtools::opt::SEConstantNode_*,_std::allocator<spvtools::opt::SEConstantNode_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_38.
                              super__Vector_base<spvtools::opt::SEConstantNode_*,_std::allocator<spvtools::opt::SEConstantNode_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
        pvVar3 = extraout_RAX_00;
      }
    }
  }
  return pvVar3;
}

Assistant:

std::vector<SEConstantNode*> GetAllTopLevelConstants(SENode* node) {
  auto nodes = std::vector<SEConstantNode*>{};
  if (auto recurrent_node = node->AsSEConstantNode()) {
    nodes.push_back(recurrent_node);
  }

  if (auto add_node = node->AsSEAddNode()) {
    for (auto child : add_node->GetChildren()) {
      auto child_nodes = GetAllTopLevelConstants(child);
      nodes.insert(nodes.end(), child_nodes.begin(), child_nodes.end());
    }
  }

  return nodes;
}